

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall QtMWidgets::DateTimePicker::wheelEvent(DateTimePicker *this,QWheelEvent *event)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  DateTimePickerPrivate *pDVar4;
  reference pSVar5;
  long lVar6;
  QPointF local_40;
  
  uVar3 = *(ulong *)(event + 0x58);
  if (uVar3 != 0) {
    pDVar4 = (this->d).d;
    local_40.xp = (qreal)QEventPoint::position();
    DateTimePickerPrivate::findMovableSection(pDVar4,&local_40);
    if ((int)(uVar3 >> 0x20) < 1) {
      if ((long)uVar3 < 0) {
        pDVar4 = (this->d).d;
        if ((long)pDVar4->movableSection != -1) {
          iVar1 = pDVar4->itemTopMargin;
          iVar2 = pDVar4->itemHeight;
          pSVar5 = QList<QtMWidgets::Section>::operator[]
                             (&(pDVar4->super_DateTimeParser).sections,(long)pDVar4->movableSection)
          ;
          pSVar5->offset = pSVar5->offset - (iVar1 + iVar2);
        }
      }
    }
    else {
      pDVar4 = (this->d).d;
      if ((long)pDVar4->movableSection != -1) {
        iVar1 = pDVar4->itemTopMargin;
        iVar2 = pDVar4->itemHeight;
        pSVar5 = QList<QtMWidgets::Section>::operator[]
                           (&(pDVar4->super_DateTimeParser).sections,(long)pDVar4->movableSection);
        pSVar5->offset = pSVar5->offset + iVar1 + iVar2;
      }
    }
    if (uVar3 >> 0x20 != 0) {
      pDVar4 = (this->d).d;
      if (0 < (pDVar4->super_DateTimeParser).sections.d.size) {
        lVar6 = 0;
        do {
          DateTimePickerPrivate::normalizeOffset(pDVar4,(int)lVar6);
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pDVar4->super_DateTimeParser).sections.d.size);
      }
      pDVar4 = (this->d).d;
      lVar6 = (long)pDVar4->movableSection;
      if (lVar6 != -1) {
        pSVar5 = QList<QtMWidgets::Section>::operator[]
                           (&(pDVar4->super_DateTimeParser).sections,lVar6);
        pSVar5->offset = 0;
      }
      DateTimePickerPrivate::updateDaysIfNeeded((this->d).d);
      DateTimePickerPrivate::updateCurrentDateTime((this->d).d);
      ((this->d).d)->movableSection = -1;
      QWidget::update();
    }
  }
  event[0xc] = (QWheelEvent)0x1;
  return;
}

Assistant:

void
DateTimePicker::wheelEvent( QWheelEvent * event )
{
	QPoint numDegrees = event->angleDelta();

	if( !numDegrees.isNull() )
	{
		d->findMovableSection( event->position() );

		if( numDegrees.y() > 0 )
			d->updateOffset( d->itemHeight + d->itemTopMargin );
		else if( numDegrees.y() < 0 )
			d->updateOffset( -( d->itemHeight + d->itemTopMargin ) );

		if( numDegrees.y() != 0 )
		{
			d->normalizeOffsets();
			d->clearOffset();
			d->updateDaysIfNeeded();
			d->updateCurrentDateTime();

			d->movableSection = -1;

			update();
		}
	}

	event->accept();
}